

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reformat.c
# Opt level: O2

void usage(char *progname)

{
  fprintf(_stderr,
          "%s: reformat json from stdin\nusage:  json_reformat [options]\n    -e escape any forward slashes (for embedding in HTML)\n    -m minimize json rather than beautify (default)\n    -s reformat a stream of multiple json entites\n    -u allow invalid UTF8 inside strings during parsing\n"
          ,progname);
  exit(1);
}

Assistant:

static void
usage(const char * progname)
{
    fprintf(stderr, "%s: reformat json from stdin\n"
            "usage:  json_reformat [options]\n"
            "    -e escape any forward slashes (for embedding in HTML)\n"
            "    -m minimize json rather than beautify (default)\n"
            "    -s reformat a stream of multiple json entites\n"
            "    -u allow invalid UTF8 inside strings during parsing\n",
            progname);
    exit(1);
}